

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

int Gia_ManBalanceGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int *pLits,int nLits)

{
  Vec_Int_t *p;
  int iVar1;
  int *pCosts;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (uint)*(undefined8 *)pObj;
  if (((-1 < (int)uVar2) && (uVar2 = uVar2 & 0x1fffffff, uVar2 != 0x1fffffff)) &&
     (uVar2 == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x11f,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  vSuper->nSize = 0;
  if (nLits == 2) {
    Vec_IntPush(vSuper,*pLits);
    Vec_IntPush(vSuper,pLits[1]);
    Gia_ManCreateGate(pNew,pObj,vSuper);
LAB_00702a73:
    iVar1 = vSuper->nSize;
  }
  else {
    if (nLits == 1) {
      Vec_IntPush(vSuper,*pLits);
      goto LAB_00702a73;
    }
    if (nLits < 3) goto LAB_00702c4c;
    uVar3 = (ulong)(uint)nLits;
    uVar4 = 0;
    do {
      if (pLits[uVar4] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar2 = (uint)pLits[uVar4] >> 1;
      p = pNew->vLevels;
      Vec_IntFillExtra(p,uVar2 + 1,0);
      if (p->nSize <= (int)uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vSuper,p->pArray[uVar2]);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar2 = nLits * 4;
    pCosts = vSuper->pArray;
    if (SBORROW4(vSuper->nCap,uVar2) != vSuper->nCap + nLits * -4 < 0) {
      if (pCosts == (int *)0x0) {
        pCosts = (int *)malloc((ulong)uVar2 << 2);
      }
      else {
        pCosts = (int *)realloc(pCosts,(ulong)uVar2 << 2);
      }
      vSuper->pArray = pCosts;
      if (pCosts == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vSuper->nCap = uVar2;
    }
    Abc_QuickSortCostData(pCosts,nLits,1,(word *)(pCosts + (uint)(nLits * 2)),pCosts + uVar3);
    uVar4 = 0;
    do {
      if ((long)vSuper->nSize <= (long)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vSuper->pArray[uVar4] = pLits[(pCosts + uVar3)[uVar4]];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    if (vSuper->nSize < nLits) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vSuper->nSize = nLits;
    do {
      uVar2 = (uint)*(undefined8 *)pObj;
      if (((~uVar2 & 0x1fffffff) == 0 || (int)uVar2 < 0) ||
         (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar2 & 0x1fffffff))) {
        Gia_ManPrepareLastTwo(pNew,vSuper);
      }
      Gia_ManCreateGate(pNew,pObj,vSuper);
      iVar1 = vSuper->nSize;
    } while (1 < iVar1);
  }
  if (iVar1 == 1) {
    return *vSuper->pArray;
  }
LAB_00702c4c:
  __assert_fail("Vec_IntSize(vSuper) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                ,0x146,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)");
}

Assistant:

int Gia_ManBalanceGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int * pLits, int nLits )
{
    assert( !Gia_ObjIsBuf(pObj) );
    Vec_IntClear( vSuper );
    if ( nLits == 1 )
        Vec_IntPush( vSuper, pLits[0] );
    else if ( nLits == 2 )
    {
        Vec_IntPush( vSuper, pLits[0] );
        Vec_IntPush( vSuper, pLits[1] );
        Gia_ManCreateGate( pNew, pObj, vSuper );
    }
    else if ( nLits > 2 )
    {
        // collect levels
        int i, * pArray, * pPerm; //int iLit;
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vSuper, Gia_ObjLevelId(pNew, Abc_Lit2Var(pLits[i])) );
        // sort by level
        Vec_IntGrow( vSuper, 4 * nLits );        
        pArray = Vec_IntArray( vSuper );
        pPerm = pArray + nLits;
        Abc_QuickSortCostData( pArray, nLits, 1, (word *)(pArray + 2 * nLits), pPerm );
        // collect in the increasing order of level
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vSuper, i, pLits[pPerm[i]] );
        Vec_IntShrink( vSuper, nLits );
/*            
        Vec_IntForEachEntry( vSuper, iLit, i )
            printf( "%d ", Gia_ObjLevel(pNew, Gia_ManObj( pNew, Abc_Lit2Var(iLit) )) );
        printf( "\n" );
*/
        // perform incremental extraction
        while ( Vec_IntSize(vSuper) > 1 )
        {
            if ( !Gia_ObjIsXor(pObj) )
                Gia_ManPrepareLastTwo( pNew, vSuper );
            Gia_ManCreateGate( pNew, pObj, vSuper );
        }
    }
    // consider trivial case
    assert( Vec_IntSize(vSuper) == 1 );
    return Vec_IntEntry(vSuper, 0);
}